

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

ActionResultHolder<bool> *
testing::internal::ActionResultHolder<bool>::PerformAction<bool(unsigned_short)>
          (Action<bool_(unsigned_short)> *action,ArgumentTuple *args)

{
  ArgumentTuple *this;
  Result value;
  ActionResultHolder<bool> *this_00;
  tuple<unsigned_short> local_1c;
  Wrapper local_19;
  tuple<unsigned_short> *local_18;
  ArgumentTuple *args_local;
  Action<bool_(unsigned_short)> *action_local;
  
  local_18 = args;
  args_local = (ArgumentTuple *)action;
  this_00 = (ActionResultHolder<bool> *)operator_new(0x10);
  this = args_local;
  std::tuple<unsigned_short>::tuple(&local_1c,local_18);
  value = Action<bool_(unsigned_short)>::Perform((Action<bool_(unsigned_short)> *)this,&local_1c);
  ReferenceOrValueWrapper<bool>::ReferenceOrValueWrapper(&local_19,value);
  ActionResultHolder(this_00,local_19);
  return this_00;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action, typename Function<F>::ArgumentTuple&& args) {
    return new ActionResultHolder(
        Wrapper(action.Perform(std::move(args))));
  }